

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O1

int Test_N_VGetArrayPointer(N_Vector W,sunindextype param_2,int myid)

{
  int iVar1;
  long lVar2;
  char *__s;
  long lVar3;
  double dVar4;
  timespec spec;
  timespec local_40;
  
  clock_gettime(4,&local_40);
  lVar3 = local_40.tv_sec - base_time_tv_sec;
  dVar4 = (double)local_40.tv_nsec;
  N_VGetArrayPointer(W);
  clock_gettime(4,&local_40);
  lVar2 = local_40.tv_sec - base_time_tv_sec;
  iVar1 = has_data(W);
  if (iVar1 == 0) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)(uint)myid);
    __s = "    Vector data == NULL \n";
  }
  else {
    N_VConst(-0.5,W);
    iVar1 = check_ans(-0.5,W,param_2);
    if (iVar1 == 0) {
      if (myid == 0) {
        puts("PASSED test -- N_VGetArrayPointer ");
      }
      max_time(W,((double)local_40.tv_nsec / 1000000000.0 + (double)lVar2) -
                 (dVar4 / 1000000000.0 + (double)lVar3));
      if (print_time == 0) {
        return 0;
      }
      printf("%s Time: %22.15e\n\n","N_VGetArrayPointer");
      return 0;
    }
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n",(ulong)(uint)myid);
    __s = "    Failed N_VConst check \n";
  }
  puts(__s);
  return 1;
}

Assistant:

int Test_N_VGetArrayPointer(N_Vector W, sunindextype local_length, int myid)
{
  int      failure = 0;
  double   start_time, stop_time, maxt;
  realtype *Wdata;

  /* get vector data, time it and set it to NULL */
  start_time = get_time();
  Wdata = N_VGetArrayPointer(W);
  stop_time = get_time();
  Wdata++; Wdata=NULL; /* Do something with pointer to surpress warning */

  /* check vector data */
  if (!has_data(W)) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Vector data == NULL \n\n");
    return(1);
  }

  N_VConst(NEG_HALF,W);
  failure = check_ans(NEG_HALF, W, local_length);

  if (failure) {
    printf(">>> FAILED test -- N_VGetArrayPointer, Proc %d \n", myid);
    printf("    Failed N_VConst check \n\n");
    return(1);
  }

  if (myid == 0)
    printf("PASSED test -- N_VGetArrayPointer \n");

  /* find max time across all processes */
  maxt = max_time(W, stop_time - start_time);
  PRINT_TIME("N_VGetArrayPointer", maxt);

  return(0);
}